

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk48(envy_bios *bios)

{
  byte bVar1;
  uint offs;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk48_entry *peVar5;
  ulong uVar6;
  
  offs = (bios->power).unk48.offset;
  iVar2 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk48.version);
    if ((bios->power).unk48.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).unk48.offset + 1,&(bios->power).unk48.hlen);
      iVar3 = bios_u8(bios,(bios->power).unk48.offset + 2,&(bios->power).unk48.rlen);
      iVar4 = bios_u8(bios,(bios->power).unk48.offset + 3,&(bios->power).unk48.entriesnum);
      (bios->power).unk48.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      bVar1 = (bios->power).unk48.entriesnum;
      peVar5 = (envy_bios_power_unk48_entry *)malloc((ulong)bVar1 << 2);
      (bios->power).unk48.entries = peVar5;
      iVar2 = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        peVar5[uVar6].offset =
             (uint)(bios->power).unk48.rlen * (int)uVar6 +
             (uint)(bios->power).unk48.hlen + (bios->power).unk48.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown THERMAL CHANNEL table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_unk48(struct envy_bios *bios) {
	struct envy_bios_power_unk48 *unk48 = &bios->power.unk48;
	int i, err = 0;

	if (!unk48->offset)
		return -EINVAL;

	bios_u8(bios, unk48->offset + 0x0, &unk48->version);
	switch(unk48->version) {
	case 0x10:
		err |= bios_u8(bios, unk48->offset + 0x1, &unk48->hlen);
		err |= bios_u8(bios, unk48->offset + 0x2, &unk48->rlen);
		err |= bios_u8(bios, unk48->offset + 0x3, &unk48->entriesnum);
		unk48->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown THERMAL CHANNEL table version 0x%x\n", unk48->version);
		return -EINVAL;
	};

	err = 0;
	unk48->entries = malloc(unk48->entriesnum * sizeof(struct envy_bios_power_unk48_entry));
	for (i = 0; i < unk48->entriesnum; i++) {
		uint32_t data = unk48->offset + unk48->hlen + i * unk48->rlen;

		unk48->entries[i].offset = data;
	}

	return 0;
}